

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<2,151>::
LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,void>::LValue
::LValue<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (LValue *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  ref_view<const_std::vector<njoy::ENDFtk::section::Type<2,_151>::LJValueType<njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_void>::JValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::LJValueType<njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_void>::JValue>_>_>
  local_20;
  
  UnresolvedLValueBase<njoy::ENDFtk::section::Type<2,151>::LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,void>::JValue>
  ::UnresolvedLValueBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((UnresolvedLValueBase<njoy::ENDFtk::section::Type<2,151>::LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,void>::JValue>
              *)this,it,end,lineNumber,MAT,MF,MT);
  local_20.rng_ =
       (vector<njoy::ENDFtk::section::Type<2,_151>::LJValueType<njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_void>::JValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::LJValueType<njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_void>::JValue>_>
        *)(this + 0x10);
  verifySize<ranges::ref_view<std::vector<njoy::ENDFtk::section::Type<2,151>::LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,void>::JValue,std::allocator<njoy::ENDFtk::section::Type<2,151>::LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,void>::JValue>>const>>
            (&local_20);
  return;
}

Assistant:

LValue( Iterator& it, const Iterator& end, long& lineNumber,
        int MAT, int MF, int MT )
  try : UnresolvedLValueBase< JValue >( it, end, lineNumber, MAT, MF, MT ) {

    verifySize( this->jValues() );
  }
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing L value resonance "
               "parameters in the unresolved Single Level Breit-Wigner "
               "representation using energy dependent fission widths" );
    throw;
  }